

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char *cstring;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t result;
  char *buffer;
  char *string_local;
  size_t stringSize_local;
  sysbvm_context_t *context_local;
  
  cstring = (char *)malloc(stringSize + 1);
  memcpy(cstring,string,stringSize);
  cstring[stringSize] = '\0';
  sVar1 = sysbvm_float32_parseCString(context,cstring);
  free(cstring);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    char *buffer = (char*)malloc(stringSize + 1);
    memcpy(buffer, string, stringSize);
    buffer[stringSize] = 0;

    sysbvm_tuple_t result = sysbvm_float32_parseCString(context, buffer);
    free(buffer);
    return result;
}